

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O0

FString ZCCTokenName(int terminal)

{
  int in_ESI;
  undefined4 in_register_0000003c;
  FScanner *this;
  int local_18;
  int sc_token;
  int terminal_local;
  
  this = (FScanner *)CONCAT44(in_register_0000003c,terminal);
  if (in_ESI == 0x30) {
    FString::FString((FString *)this,"end of file");
  }
  else {
    if ((in_ESI < 1) || (0x8e < in_ESI)) {
      local_18 = -in_ESI;
    }
    else {
      local_18 = (int)BackTokenMap[in_ESI];
      if (local_18 == 0) {
        local_18 = -in_ESI;
      }
    }
    FScanner::TokenName(this,local_18,(char *)0x0);
  }
  return (FString)(char *)this;
}

Assistant:

static FString ZCCTokenName(int terminal)
{
	if (terminal == ZCC_EOF)
	{
		return "end of file";
	}
	int sc_token;
	if (terminal > 0 && terminal < (int)countof(BackTokenMap))
	{
		sc_token = BackTokenMap[terminal];
		if (sc_token == 0)
		{ // This token was not initialized. Whoops!
			sc_token = -terminal;
		}
	}
	else
	{ // This should never happen.
		sc_token = -terminal;
	}
	return FScanner::TokenName(sc_token);
}